

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O2

int __thiscall Configuration::getInt(Configuration *this,string *key,int ifEmpty)

{
  int iVar1;
  iterator iVar2;
  mapped_type_conflict *pmVar3;
  Configuration *this_00;
  char *format;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->integerConfiguration)._M_t,key);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->integerConfiguration)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (Configuration *)&stack0xffffffffffffffb8;
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,(string *)key);
    iVar1 = getType(this_00,(string *)&stack0xffffffffffffffb8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    if (iVar1 == 3) {
      format = "Missing %s in configuration. Using default value: 0%o";
      iVar1 = 0x71;
    }
    else {
      format = "Missing %s in configuration. Using default value: %i";
      iVar1 = 0x75;
    }
    softHSMLog(4,"getInt",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/Configuration.cpp"
               ,iVar1,format,(key->_M_dataplus)._M_p,ifEmpty);
  }
  else {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->integerConfiguration,key);
    ifEmpty = *pmVar3;
  }
  return ifEmpty;
}

Assistant:

int Configuration::getInt(std::string key, int ifEmpty /* = 0 */)
{
	if (integerConfiguration.find(key) != integerConfiguration.end())
	{
		return integerConfiguration[key];
	}
	else
	{
		if (getType(key) == CONFIG_TYPE_INT_OCTAL)
		{
			WARNING_MSG("Missing %s in configuration. Using default value: 0%o", key.c_str(), ifEmpty);
		}
		else
		{
			WARNING_MSG("Missing %s in configuration. Using default value: %i", key.c_str(), ifEmpty);
		}
		return ifEmpty;
	}
}